

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O0

char * ngx_http_log_open_file_cache(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  int iVar1;
  ngx_str_t *pnVar2;
  ngx_open_file_cache_t *pnVar3;
  ulong local_70;
  ngx_uint_t i;
  ngx_int_t min_uses;
  ngx_int_t max;
  ngx_str_t s;
  ngx_str_t *value;
  time_t valid;
  time_t inactive;
  ngx_http_log_loc_conf_t *llcf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  if (*(long *)((long)conf + 8) == -1) {
    s.data = (u_char *)cf->args->elts;
    min_uses = 0;
    valid = 10;
    value = (ngx_str_t *)0x3c;
    i = 1;
    for (local_70 = 1; local_70 < cf->args->nelts; local_70 = local_70 + 1) {
      iVar1 = strncmp(*(char **)(s.data + local_70 * 0x10 + 8),"max=",4);
      if (iVar1 == 0) {
        min_uses = ngx_atoi((u_char *)(*(long *)(s.data + local_70 * 0x10 + 8) + 4),
                            *(long *)(s.data + local_70 * 0x10) - 4);
        pnVar2 = (ngx_str_t *)min_uses;
joined_r0x001731be:
        if (pnVar2 == (ngx_str_t *)0xffffffffffffffff) {
LAB_0017336a:
          ngx_conf_log_error(1,cf,0,"invalid \"open_log_file_cache\" parameter \"%V\"",
                             s.data + local_70 * 0x10);
          return (char *)0xffffffffffffffff;
        }
      }
      else {
        iVar1 = strncmp(*(char **)(s.data + local_70 * 0x10 + 8),"inactive=",9);
        if (iVar1 == 0) {
          max = *(long *)(s.data + local_70 * 0x10) + -9;
          s.len = *(long *)(s.data + local_70 * 0x10 + 8) + 9;
          valid = ngx_parse_time((ngx_str_t *)&max,1);
          pnVar2 = (ngx_str_t *)valid;
          goto joined_r0x001731be;
        }
        iVar1 = strncmp(*(char **)(s.data + local_70 * 0x10 + 8),"min_uses=",9);
        if (iVar1 == 0) {
          i = ngx_atoi((u_char *)(*(long *)(s.data + local_70 * 0x10 + 8) + 9),
                       *(long *)(s.data + local_70 * 0x10) - 9);
          pnVar2 = (ngx_str_t *)i;
          goto joined_r0x001731be;
        }
        iVar1 = strncmp(*(char **)(s.data + local_70 * 0x10 + 8),"valid=",6);
        if (iVar1 == 0) {
          max = *(long *)(s.data + local_70 * 0x10) + -6;
          s.len = *(long *)(s.data + local_70 * 0x10 + 8) + 6;
          value = (ngx_str_t *)ngx_parse_time((ngx_str_t *)&max,1);
          pnVar2 = value;
          goto joined_r0x001731be;
        }
        iVar1 = strcmp(*(char **)(s.data + local_70 * 0x10 + 8),"off");
        if (iVar1 != 0) goto LAB_0017336a;
        *(undefined8 *)((long)conf + 8) = 0;
      }
    }
    if (*(long *)((long)conf + 8) == 0) {
      cf_local = (ngx_conf_t *)0x0;
    }
    else if (min_uses == 0) {
      ngx_conf_log_error(1,cf,0,"\"open_log_file_cache\" must have \"max\" parameter");
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      pnVar3 = ngx_open_file_cache_init(cf->pool,min_uses,valid);
      *(ngx_open_file_cache_t **)((long)conf + 8) = pnVar3;
      if (*(long *)((long)conf + 8) == 0) {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
      else {
        *(ngx_str_t **)((long)conf + 0x10) = value;
        *(ngx_uint_t *)((long)conf + 0x18) = i;
        cf_local = (ngx_conf_t *)0x0;
      }
    }
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_log_open_file_cache(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_log_loc_conf_t *llcf = conf;

    time_t       inactive, valid;
    ngx_str_t   *value, s;
    ngx_int_t    max, min_uses;
    ngx_uint_t   i;

    if (llcf->open_file_cache != NGX_CONF_UNSET_PTR) {
        return "is duplicate";
    }

    value = cf->args->elts;

    max = 0;
    inactive = 10;
    valid = 60;
    min_uses = 1;

    for (i = 1; i < cf->args->nelts; i++) {

        if (ngx_strncmp(value[i].data, "max=", 4) == 0) {

            max = ngx_atoi(value[i].data + 4, value[i].len - 4);
            if (max == NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "inactive=", 9) == 0) {

            s.len = value[i].len - 9;
            s.data = value[i].data + 9;

            inactive = ngx_parse_time(&s, 1);
            if (inactive == (time_t) NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "min_uses=", 9) == 0) {

            min_uses = ngx_atoi(value[i].data + 9, value[i].len - 9);
            if (min_uses == NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "valid=", 6) == 0) {

            s.len = value[i].len - 6;
            s.data = value[i].data + 6;

            valid = ngx_parse_time(&s, 1);
            if (valid == (time_t) NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strcmp(value[i].data, "off") == 0) {

            llcf->open_file_cache = NULL;

            continue;
        }

    failed:

        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "invalid \"open_log_file_cache\" parameter \"%V\"",
                           &value[i]);
        return NGX_CONF_ERROR;
    }

    if (llcf->open_file_cache == NULL) {
        return NGX_CONF_OK;
    }

    if (max == 0) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                        "\"open_log_file_cache\" must have \"max\" parameter");
        return NGX_CONF_ERROR;
    }

    llcf->open_file_cache = ngx_open_file_cache_init(cf->pool, max, inactive);

    if (llcf->open_file_cache) {

        llcf->open_file_cache_valid = valid;
        llcf->open_file_cache_min_uses = min_uses;

        return NGX_CONF_OK;
    }

    return NGX_CONF_ERROR;
}